

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  parasail_result_t *ppVar11;
  __m128i *palVar12;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  longlong *plVar19;
  ulong uVar20;
  longlong *plVar21;
  __m128i *ptr_02;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  bool bVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined4 uVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  longlong lVar49;
  __m128i_64_t A_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i_64_t A;
  undefined1 auVar65 [16];
  __m128i_64_t B_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_64_t B;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i_64_t B_4;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar85;
  undefined1 auVar80 [16];
  int iVar86;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar92;
  undefined1 auVar90 [16];
  int iVar93;
  int iVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int iVar99;
  int iVar100;
  undefined1 auVar97 [16];
  int iVar104;
  undefined1 auVar101 [16];
  int iVar105;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  long local_48;
  undefined8 uStack_40;
  int64_t iVar74;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_1();
        }
        else {
          uVar26 = uVar2 - 1;
          uVar31 = (ulong)uVar2 + 1 >> 1;
          uVar5 = (ulong)uVar26 % uVar31;
          uVar27 = (ulong)(uint)open;
          iVar28 = -open;
          iVar22 = ppVar4->min;
          uVar20 = 0x8000000000000000 - (long)iVar22;
          if (iVar22 != iVar28 && SBORROW4(iVar22,iVar28) == iVar22 + open < 0) {
            uVar20 = uVar27 | 0x8000000000000000;
          }
          iVar22 = ppVar4->max;
          uVar30 = (uint)uVar31;
          iVar48 = (int)(uVar26 / uVar31);
          ppVar11 = parasail_result_new();
          if (ppVar11 == (parasail_result_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          ppVar11->flag =
               (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
               (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x2800802;
          palVar12 = parasail_memalign___m128i(0x10,uVar31);
          ptr = parasail_memalign___m128i(0x10,uVar31);
          ptr_00 = parasail_memalign___m128i(0x10,uVar31);
          ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
          auVar63._0_4_ = -(uint)((int)((ulong)palVar12 >> 0x20) == 0 && (int)palVar12 == 0);
          auVar63._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
          auVar63._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
          auVar63._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
          iVar16 = movmskps((int)palVar12,auVar63);
          if (iVar16 == 0) {
            iVar16 = s2Len + -1;
            uVar17 = uVar20 + 1;
            local_48 = 0x7ffffffffffffffe - (long)iVar22;
            auVar34._8_4_ = (int)uVar17;
            auVar34._0_8_ = uVar17;
            auVar34._12_4_ = (int)(uVar17 >> 0x20);
            uStack_40 = 0;
            uVar40 = (undefined4)((ulong)local_48 >> 0x20);
            auVar35._8_4_ = (int)local_48;
            auVar35._0_8_ = local_48;
            auVar35._12_4_ = uVar40;
            auVar61._8_8_ = -(ulong)(iVar48 == 1);
            auVar61._0_8_ = -(ulong)(uVar26 < uVar30);
            uVar18 = (ulong)iVar28;
            uVar24 = 0;
            do {
              lVar25 = 0;
              plVar19 = &local_68;
              plVar21 = &local_58;
              bVar32 = true;
              do {
                bVar29 = bVar32;
                if (s1_beg == 0) {
                  lVar25 = uVar18 - (lVar25 * uVar31 + uVar24) * (ulong)(uint)gap;
                }
                else {
                  lVar25 = 0;
                }
                *plVar21 = lVar25;
                *plVar19 = lVar25 - uVar27;
                lVar25 = 1;
                plVar19 = &lStack_60;
                plVar21 = &lStack_50;
                bVar32 = false;
              } while (bVar29);
              palVar12[uVar24][0] = local_58;
              palVar12[uVar24][1] = lStack_50;
              ptr_00[uVar24][0] = local_68;
              ptr_00[uVar24][1] = lStack_60;
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar31);
            *ptr_01 = 0;
            auVar65 = _DAT_00903aa0;
            auVar63 = _DAT_00903a90;
            lVar25 = (ulong)(uint)s2Len - 1;
            auVar46._8_4_ = (int)lVar25;
            auVar46._0_8_ = lVar25;
            auVar46._12_4_ = (int)((ulong)lVar25 >> 0x20);
            auVar46 = auVar46 ^ _DAT_00903aa0;
            uVar24 = 0;
            do {
              auVar69._8_4_ = (int)uVar24;
              auVar69._0_8_ = uVar24;
              auVar69._12_4_ = (int)(uVar24 >> 0x20);
              auVar69 = (auVar69 | auVar63) ^ auVar65;
              if ((bool)(~(auVar69._4_4_ == auVar46._4_4_ && auVar46._0_4_ < auVar69._0_4_ ||
                          auVar46._4_4_ < auVar69._4_4_) & 1)) {
                iVar22 = 0;
                if (s2_beg == 0) {
                  iVar22 = iVar28;
                }
                ptr_01[uVar24 + 1] = (long)iVar22;
              }
              if ((auVar69._12_4_ != auVar46._12_4_ || auVar69._8_4_ <= auVar46._8_4_) &&
                  auVar69._12_4_ <= auVar46._12_4_) {
                iVar22 = iVar28 - gap;
                if (s2_beg != 0) {
                  iVar22 = 0;
                }
                ptr_01[uVar24 + 2] = (long)iVar22;
              }
              auVar69 = _DAT_00904920;
              uVar24 = uVar24 + 2;
              iVar28 = iVar28 + gap * -2;
            } while ((s2Len + 1U & 0xfffffffe) != uVar24);
            uVar24 = 0;
            auVar63 = auVar34;
            auVar65 = auVar34;
            iVar22 = iVar16;
            do {
              ptr_02 = ptr;
              ptr = palVar12;
              iVar28 = ppVar4->mapper[(byte)s2[uVar24]];
              iVar74 = ptr_01[uVar24];
              lVar49 = ptr[uVar30 - 1][0];
              lVar25 = 0;
              auVar68 = auVar34;
              do {
                plVar1 = (long *)((long)pvVar3 + lVar25 + (long)iVar28 * (long)(int)uVar30 * 0x10);
                auVar75._0_8_ = iVar74 + *plVar1;
                auVar75._8_8_ = lVar49 + plVar1[1];
                auVar46 = *(undefined1 (*) [16])((long)*ptr_00 + lVar25);
                auVar87 = auVar75 ^ auVar69;
                auVar80 = auVar46 ^ auVar69;
                iVar93 = -(uint)(auVar80._0_4_ < auVar87._0_4_);
                iVar85 = auVar80._4_4_;
                auVar94._4_4_ = -(uint)(iVar85 < auVar87._4_4_);
                iVar98 = -(uint)(auVar80._8_4_ < auVar87._8_4_);
                iVar86 = auVar80._12_4_;
                auVar94._12_4_ = -(uint)(iVar86 < auVar87._12_4_);
                auVar101._4_4_ = iVar93;
                auVar101._0_4_ = iVar93;
                auVar101._8_4_ = iVar98;
                auVar101._12_4_ = iVar98;
                auVar88._4_4_ = -(uint)(auVar87._4_4_ == iVar85);
                auVar88._12_4_ = -(uint)(auVar87._12_4_ == iVar86);
                auVar88._0_4_ = auVar88._4_4_;
                auVar88._8_4_ = auVar88._12_4_;
                auVar94._0_4_ = auVar94._4_4_;
                auVar94._8_4_ = auVar94._12_4_;
                auVar94 = auVar94 | auVar88 & auVar101;
                auVar95 = ~auVar94 & auVar46 | auVar75 & auVar94;
                auVar76 = auVar95 ^ auVar69;
                auVar89 = auVar68 ^ auVar69;
                iVar93 = -(uint)(auVar89._0_4_ < auVar76._0_4_);
                iVar91 = auVar89._4_4_;
                iVar104 = -(uint)(iVar91 < auVar76._4_4_);
                iVar98 = -(uint)(auVar89._8_4_ < auVar76._8_4_);
                iVar92 = auVar89._12_4_;
                iVar105 = -(uint)(iVar92 < auVar76._12_4_);
                auVar87._4_4_ = iVar93;
                auVar87._0_4_ = iVar93;
                auVar87._8_4_ = iVar98;
                auVar87._12_4_ = iVar98;
                iVar93 = -(uint)(auVar76._4_4_ == iVar91);
                iVar98 = -(uint)(auVar76._12_4_ == iVar92);
                auVar51._4_4_ = iVar93;
                auVar51._0_4_ = iVar93;
                auVar51._8_4_ = iVar98;
                auVar51._12_4_ = iVar98;
                auVar77._4_4_ = iVar104;
                auVar77._0_4_ = iVar104;
                auVar77._8_4_ = iVar105;
                auVar77._12_4_ = iVar105;
                auVar77 = auVar77 | auVar51 & auVar87;
                auVar95 = ~auVar77 & auVar68 | auVar95 & auVar77;
                *(undefined1 (*) [16])((long)*ptr_02 + lVar25) = auVar95;
                auVar87 = auVar63 ^ auVar69;
                auVar76 = auVar95 ^ auVar69;
                iVar104 = -(uint)(auVar76._0_4_ < auVar87._0_4_);
                iVar93 = auVar76._4_4_;
                auVar96._4_4_ = -(uint)(iVar93 < auVar87._4_4_);
                iVar105 = -(uint)(auVar76._8_4_ < auVar87._8_4_);
                iVar98 = auVar76._12_4_;
                auVar96._12_4_ = -(uint)(iVar98 < auVar87._12_4_);
                auVar102._4_4_ = iVar104;
                auVar102._0_4_ = iVar104;
                auVar102._8_4_ = iVar105;
                auVar102._12_4_ = iVar105;
                auVar62._4_4_ = -(uint)(auVar87._4_4_ == iVar93);
                auVar62._12_4_ = -(uint)(auVar87._12_4_ == iVar98);
                auVar62._0_4_ = auVar62._4_4_;
                auVar62._8_4_ = auVar62._12_4_;
                auVar96._0_4_ = auVar96._4_4_;
                auVar96._8_4_ = auVar96._12_4_;
                auVar96 = auVar96 | auVar62 & auVar102;
                auVar63 = ~auVar96 & auVar95 | auVar63 & auVar96;
                auVar87 = auVar35 ^ auVar69;
                iVar104 = -(uint)(auVar87._0_4_ < auVar76._0_4_);
                iVar105 = -(uint)(auVar87._4_4_ < iVar93);
                iVar99 = -(uint)(auVar87._8_4_ < auVar76._8_4_);
                iVar100 = -(uint)(auVar87._12_4_ < iVar98);
                auVar103._4_4_ = iVar104;
                auVar103._0_4_ = iVar104;
                auVar103._8_4_ = iVar99;
                auVar103._12_4_ = iVar99;
                auVar76._4_4_ = -(uint)(auVar87._4_4_ == iVar93);
                auVar76._12_4_ = -(uint)(auVar87._12_4_ == iVar98);
                auVar76._0_4_ = auVar76._4_4_;
                auVar76._8_4_ = auVar76._12_4_;
                auVar52._4_4_ = iVar105;
                auVar52._0_4_ = iVar105;
                auVar52._8_4_ = iVar100;
                auVar52._12_4_ = iVar100;
                auVar52 = auVar52 | auVar76 & auVar103;
                auVar87 = ~auVar52 & auVar95 | auVar35 & auVar52;
                auVar35 = auVar87 ^ auVar69;
                iVar93 = -(uint)(auVar35._0_4_ < auVar80._0_4_);
                iVar98 = -(uint)(auVar35._4_4_ < iVar85);
                iVar104 = -(uint)(auVar35._8_4_ < auVar80._8_4_);
                iVar105 = -(uint)(auVar35._12_4_ < iVar86);
                auVar97._4_4_ = iVar93;
                auVar97._0_4_ = iVar93;
                auVar97._8_4_ = iVar104;
                auVar97._12_4_ = iVar104;
                auVar80._4_4_ = -(uint)(auVar35._4_4_ == iVar85);
                auVar80._12_4_ = -(uint)(auVar35._12_4_ == iVar86);
                auVar80._0_4_ = auVar80._4_4_;
                auVar80._8_4_ = auVar80._12_4_;
                auVar81._4_4_ = iVar98;
                auVar81._0_4_ = iVar98;
                auVar81._8_4_ = iVar105;
                auVar81._12_4_ = iVar105;
                auVar81 = auVar81 | auVar80 & auVar97;
                auVar87 = ~auVar81 & auVar46 | auVar87 & auVar81;
                auVar35 = auVar87 ^ auVar69;
                iVar93 = -(uint)(auVar35._0_4_ < auVar89._0_4_);
                auVar41._4_4_ = -(uint)(auVar35._4_4_ < iVar91);
                iVar98 = -(uint)(auVar35._8_4_ < auVar89._8_4_);
                auVar41._12_4_ = -(uint)(auVar35._12_4_ < iVar92);
                auVar53._4_4_ = iVar93;
                auVar53._0_4_ = iVar93;
                auVar53._8_4_ = iVar98;
                auVar53._12_4_ = iVar98;
                auVar89._4_4_ = -(uint)(auVar35._4_4_ == iVar91);
                auVar89._12_4_ = -(uint)(auVar35._12_4_ == iVar92);
                auVar89._0_4_ = auVar89._4_4_;
                auVar89._8_4_ = auVar89._12_4_;
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar41 = auVar41 | auVar89 & auVar53;
                auVar35 = ~auVar41 & auVar68 | auVar87 & auVar41;
                auVar78._0_8_ = auVar95._0_8_ - (ulong)(uint)open;
                auVar78._8_8_ = auVar95._8_8_ - (ulong)(uint)open;
                auVar70._0_8_ = auVar46._0_8_ - (ulong)(uint)gap;
                auVar70._8_8_ = auVar46._8_8_ - (ulong)(uint)gap;
                auVar46 = auVar70 ^ auVar69;
                auVar87 = auVar78 ^ auVar69;
                iVar93 = -(uint)(auVar87._0_4_ < auVar46._0_4_);
                iVar104 = auVar87._4_4_;
                auVar54._4_4_ = -(uint)(iVar104 < auVar46._4_4_);
                iVar98 = -(uint)(auVar87._8_4_ < auVar46._8_4_);
                iVar105 = auVar87._12_4_;
                auVar54._12_4_ = -(uint)(iVar105 < auVar46._12_4_);
                auVar90._4_4_ = iVar93;
                auVar90._0_4_ = iVar93;
                auVar90._8_4_ = iVar98;
                auVar90._12_4_ = iVar98;
                auVar95._4_4_ = -(uint)(auVar46._4_4_ == iVar104);
                auVar95._12_4_ = -(uint)(auVar46._12_4_ == iVar105);
                auVar95._0_4_ = auVar95._4_4_;
                auVar95._8_4_ = auVar95._12_4_;
                auVar54._0_4_ = auVar54._4_4_;
                auVar54._8_4_ = auVar54._12_4_;
                auVar54 = auVar54 | auVar95 & auVar90;
                *(undefined1 (*) [16])((long)*ptr_00 + lVar25) =
                     ~auVar54 & auVar78 | auVar70 & auVar54;
                auVar66._0_8_ = auVar68._0_8_ - (ulong)(uint)gap;
                auVar66._8_8_ = auVar68._8_8_ - (ulong)(uint)gap;
                auVar46 = auVar66 ^ auVar69;
                iVar93 = -(uint)(auVar87._0_4_ < auVar46._0_4_);
                auVar55._4_4_ = -(uint)(iVar104 < auVar46._4_4_);
                iVar98 = -(uint)(auVar87._8_4_ < auVar46._8_4_);
                auVar55._12_4_ = -(uint)(iVar105 < auVar46._12_4_);
                auVar71._4_4_ = iVar93;
                auVar71._0_4_ = iVar93;
                auVar71._8_4_ = iVar98;
                auVar71._12_4_ = iVar98;
                auVar67._4_4_ = -(uint)(auVar46._4_4_ == iVar104);
                auVar67._12_4_ = -(uint)(auVar46._12_4_ == iVar105);
                auVar67._0_4_ = auVar67._4_4_;
                auVar67._8_4_ = auVar67._12_4_;
                auVar55._0_4_ = auVar55._4_4_;
                auVar55._8_4_ = auVar55._12_4_;
                auVar55 = auVar55 | auVar67 & auVar71;
                auVar68 = ~auVar55 & auVar78 | auVar66 & auVar55;
                plVar1 = (long *)((long)*ptr + lVar25);
                iVar74 = *plVar1;
                lVar49 = plVar1[1];
                lVar25 = lVar25 + 0x10;
              } while (uVar31 << 4 != lVar25);
              bVar32 = true;
              do {
                bVar29 = bVar32;
                uVar13 = uVar18;
                if (s2_beg == 0) {
                  uVar13 = ptr_01[uVar24 + 1] - uVar27;
                }
                auVar68._8_8_ = auVar68._0_8_;
                auVar68._0_8_ = uVar13;
                lVar25 = 0;
                do {
                  auVar46 = *(undefined1 (*) [16])((long)*ptr_02 + lVar25);
                  auVar87 = auVar68 ^ auVar69;
                  auVar76 = auVar46 ^ auVar69;
                  iVar28 = -(uint)(auVar87._0_4_ < auVar76._0_4_);
                  iVar98 = -(uint)(auVar87._4_4_ < auVar76._4_4_);
                  iVar93 = -(uint)(auVar87._8_4_ < auVar76._8_4_);
                  iVar104 = -(uint)(auVar87._12_4_ < auVar76._12_4_);
                  auVar82._4_4_ = iVar28;
                  auVar82._0_4_ = iVar28;
                  auVar82._8_4_ = iVar93;
                  auVar82._12_4_ = iVar93;
                  iVar28 = -(uint)(auVar76._4_4_ == auVar87._4_4_);
                  iVar93 = -(uint)(auVar76._12_4_ == auVar87._12_4_);
                  auVar56._4_4_ = iVar28;
                  auVar56._0_4_ = iVar28;
                  auVar56._8_4_ = iVar93;
                  auVar56._12_4_ = iVar93;
                  auVar72._4_4_ = iVar98;
                  auVar72._0_4_ = iVar98;
                  auVar72._8_4_ = iVar104;
                  auVar72._12_4_ = iVar104;
                  auVar72 = auVar72 | auVar56 & auVar82;
                  auVar87 = ~auVar72 & auVar68 | auVar46 & auVar72;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar25) = auVar87;
                  auVar46 = auVar35 ^ auVar69;
                  auVar76 = auVar87 ^ auVar69;
                  iVar28 = -(uint)(auVar46._0_4_ < auVar76._0_4_);
                  iVar93 = auVar76._4_4_;
                  auVar57._4_4_ = -(uint)(auVar46._4_4_ < iVar93);
                  iVar104 = auVar76._12_4_;
                  iVar98 = -(uint)(auVar46._8_4_ < auVar76._8_4_);
                  auVar57._12_4_ = -(uint)(auVar46._12_4_ < iVar104);
                  auVar83._4_4_ = iVar28;
                  auVar83._0_4_ = iVar28;
                  auVar83._8_4_ = iVar98;
                  auVar83._12_4_ = iVar98;
                  auVar42._4_4_ = -(uint)(auVar46._4_4_ == iVar93);
                  auVar42._12_4_ = -(uint)(auVar46._12_4_ == iVar104);
                  auVar42._0_4_ = auVar42._4_4_;
                  auVar42._8_4_ = auVar42._12_4_;
                  auVar57._0_4_ = auVar57._4_4_;
                  auVar57._8_4_ = auVar57._12_4_;
                  auVar57 = auVar57 | auVar42 & auVar83;
                  auVar35 = ~auVar57 & auVar87 | auVar35 & auVar57;
                  auVar46 = auVar63 ^ auVar69;
                  iVar28 = -(uint)(auVar76._0_4_ < auVar46._0_4_);
                  auVar58._4_4_ = -(uint)(iVar93 < auVar46._4_4_);
                  iVar98 = -(uint)(auVar76._8_4_ < auVar46._8_4_);
                  auVar58._12_4_ = -(uint)(iVar104 < auVar46._12_4_);
                  auVar84._4_4_ = iVar28;
                  auVar84._0_4_ = iVar28;
                  auVar84._8_4_ = iVar98;
                  auVar84._12_4_ = iVar98;
                  auVar64._4_4_ = -(uint)(auVar46._4_4_ == iVar93);
                  auVar64._12_4_ = -(uint)(auVar46._12_4_ == iVar104);
                  auVar64._0_4_ = auVar64._4_4_;
                  auVar64._8_4_ = auVar64._12_4_;
                  auVar58._0_4_ = auVar58._4_4_;
                  auVar58._8_4_ = auVar58._12_4_;
                  auVar58 = auVar58 | auVar64 & auVar84;
                  auVar63 = ~auVar58 & auVar87 | auVar63 & auVar58;
                  auVar73._0_8_ = auVar87._0_8_ - (ulong)(uint)open;
                  auVar73._8_8_ = auVar87._8_8_ - (ulong)(uint)open;
                  lVar14 = auVar68._8_8_;
                  auVar68._0_8_ = auVar68._0_8_ - (ulong)(uint)gap;
                  auVar68._8_8_ = lVar14 - (ulong)(uint)gap;
                  auVar73 = auVar73 ^ auVar69;
                  auVar46 = auVar68 ^ auVar69;
                  iVar28 = -(uint)(auVar73._0_4_ < auVar46._0_4_);
                  auVar59._4_4_ = -(uint)(auVar73._4_4_ < auVar46._4_4_);
                  iVar93 = -(uint)(auVar73._8_4_ < auVar46._8_4_);
                  auVar59._12_4_ = -(uint)(auVar73._12_4_ < auVar46._12_4_);
                  auVar79._4_4_ = iVar28;
                  auVar79._0_4_ = iVar28;
                  auVar79._8_4_ = iVar93;
                  auVar79._12_4_ = iVar93;
                  auVar36._4_4_ = -(uint)(auVar46._4_4_ == auVar73._4_4_);
                  auVar36._12_4_ = -(uint)(auVar46._12_4_ == auVar73._12_4_);
                  auVar36._0_4_ = auVar36._4_4_;
                  auVar36._8_4_ = auVar36._12_4_;
                  auVar59._0_4_ = auVar59._4_4_;
                  auVar59._8_4_ = auVar59._12_4_;
                  uVar9 = movmskps((int)uVar13,auVar59 | auVar36 & auVar79);
                  uVar13 = (ulong)uVar9;
                  if (uVar9 == 0) goto LAB_005747ca;
                  lVar25 = lVar25 + 0x10;
                } while (uVar31 << 4 != lVar25);
                bVar32 = false;
              } while (bVar29);
LAB_005747ca:
              lVar14 = auVar65._0_8_;
              lVar25 = ptr_02[uVar5][0];
              uVar13 = ptr_02[uVar5][1];
              uVar33 = auVar65._8_8_;
              uVar23 = uVar33;
              if ((long)uVar33 < (long)uVar13) {
                uVar23 = uVar13;
              }
              lVar15 = lVar14;
              if (lVar14 < lVar25) {
                lVar15 = lVar25;
              }
              auVar60._8_8_ = -(ulong)((long)uVar33 < (long)uVar13);
              auVar60._0_8_ = -(ulong)(lVar14 < lVar25);
              auVar60 = auVar60 & auVar61;
              if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar60 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar60 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar60 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar60 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar60 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar60 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar60 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar60 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar60 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                iVar22 = (int)uVar24;
              }
              auVar65._8_8_ = uVar23;
              auVar65._0_8_ = lVar15;
              uVar24 = uVar24 + 1;
              palVar12 = ptr_02;
              if (uVar24 == (uint)s2Len) {
                if ((s2_end != 0) && (uVar17 = uVar23, iVar48 < 1)) {
                  do {
                    uVar17 = auVar65._0_8_;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = uVar17;
                    auVar65 = auVar7 << 0x40;
                  } while (iVar48 < 0);
                }
                uVar9 = uVar26;
                if ((s1_end != 0) && (((ulong)uVar2 + 1 & 0x7ffffffe) != 0)) {
                  uVar31 = 0;
                  uVar27 = uVar17;
                  do {
                    uVar10 = 0;
                    if ((uVar31 & 1) != 0) {
                      uVar10 = uVar30;
                    }
                    uVar10 = uVar10 + ((uint)(uVar31 >> 1) & 0x7fffffff);
                    uVar17 = uVar27;
                    iVar28 = iVar22;
                    uVar8 = uVar9;
                    if (((int)uVar10 < (int)uVar2) &&
                       (uVar17 = (*ptr_02)[uVar31], iVar28 = iVar16, uVar8 = uVar10,
                       (long)uVar17 <= (long)uVar27)) {
                      if ((int)uVar9 <= (int)uVar10) {
                        uVar10 = uVar9;
                      }
                      if (iVar22 != iVar16) {
                        uVar10 = uVar9;
                      }
                      bVar32 = uVar17 == uVar27;
                      uVar17 = uVar27;
                      iVar28 = iVar22;
                      uVar8 = uVar9;
                      if (bVar32) {
                        uVar8 = uVar10;
                      }
                    }
                    uVar9 = uVar8;
                    iVar22 = iVar28;
                    uVar31 = uVar31 + 1;
                    uVar27 = uVar17;
                  } while ((uVar30 & 0x3fffffff) * 2 != (int)uVar31);
                }
                iVar28 = (int)uVar17;
                if (s2_end == 0 && s1_end == 0) {
                  lVar49 = ptr_02[uVar5][0];
                  iVar28 = (int)ptr_02[uVar5][1];
                  iVar22 = iVar16;
                  uVar9 = uVar26;
                  if (iVar48 < 1) {
                    do {
                      iVar28 = (int)lVar49;
                      lVar49 = 0;
                    } while (iVar48 < 0);
                  }
                }
                auVar37._8_4_ = (int)uVar20;
                auVar37._0_8_ = uVar20;
                auVar37._12_4_ = (int)(uVar20 >> 0x20);
                auVar35 = auVar35 ^ auVar69;
                auVar37 = auVar37 ^ auVar69;
                iVar48 = -(uint)(auVar37._0_4_ < auVar35._0_4_);
                iVar16 = -(uint)(auVar37._4_4_ < auVar35._4_4_);
                iVar93 = -(uint)(auVar37._8_4_ < auVar35._8_4_);
                iVar98 = -(uint)(auVar37._12_4_ < auVar35._12_4_);
                auVar38._4_4_ = -(uint)(auVar37._4_4_ == auVar35._4_4_);
                auVar38._12_4_ = -(uint)(auVar37._12_4_ == auVar35._12_4_);
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar6._4_4_ = iVar48;
                auVar6._0_4_ = iVar48;
                auVar6._8_4_ = iVar93;
                auVar6._12_4_ = iVar93;
                auVar43._4_4_ = iVar16;
                auVar43._0_4_ = iVar16;
                auVar43._8_4_ = iVar98;
                auVar43._12_4_ = iVar98;
                auVar39._8_4_ = 0xffffffff;
                auVar39._0_8_ = 0xffffffffffffffff;
                auVar39._12_4_ = 0xffffffff;
                auVar44._8_4_ = (int)local_48;
                auVar44._0_8_ = local_48;
                auVar44._12_4_ = uVar40;
                auVar63 = auVar63 ^ auVar69;
                auVar44 = auVar44 ^ auVar69;
                iVar48 = -(uint)(auVar44._0_4_ < auVar63._0_4_);
                auVar47._4_4_ = -(uint)(auVar44._4_4_ < auVar63._4_4_);
                iVar16 = -(uint)(auVar44._8_4_ < auVar63._8_4_);
                auVar47._12_4_ = -(uint)(auVar44._12_4_ < auVar63._12_4_);
                auVar50._4_4_ = iVar48;
                auVar50._0_4_ = iVar48;
                auVar50._8_4_ = iVar16;
                auVar50._12_4_ = iVar16;
                auVar45._4_4_ = -(uint)(auVar44._4_4_ == auVar63._4_4_);
                auVar45._12_4_ = -(uint)(auVar44._12_4_ == auVar63._12_4_);
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar47._0_4_ = auVar47._4_4_;
                auVar47._8_4_ = auVar47._12_4_;
                auVar63 = auVar47 | auVar45 & auVar50 | auVar39 ^ (auVar43 | auVar38 & auVar6);
                if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar63 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar63[0xf] < '\0') {
                  *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                  iVar28 = 0;
                  iVar22 = 0;
                  uVar9 = 0;
                }
                ppVar11->score = iVar28;
                ppVar11->end_query = uVar9;
                ppVar11->end_ref = iVar22;
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                parasail_free(ptr_02);
                return ppVar11;
              }
            } while( true );
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}